

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Exec
          (SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *this,
          Matcher *matcher,Char *input,CharCount inputLength,CharCount *matchStart,
          CharCount *inputOffset,CharCount *nextSyncInputOffset,uint8 **instPointer,
          ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((((matcher->program).ptr)->rep).insts.litbufLen -
      (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.super_LiteralMixin.offset <
      (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.super_LiteralMixin.length << 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x2ae,
                       "(length * CaseInsensitive::EquivClassSize <= matcher.program->rep.insts.litbufLen - offset)"
                       ,
                       "length * CaseInsensitive::EquivClassSize <= matcher.program->rep.insts.litbufLen - offset"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = TextbookBoyerMoore<char16_t>::Match<4u,1u>
                    (&(this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner,input,
                     inputLength,inputOffset,
                     (((matcher->program).ptr)->rep).insts.litbuf.ptr +
                     (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.super_LiteralMixin.
                     offset,(this->super_EquivScannerMixinT<1U>).super_ScannerMixin.
                            super_LiteralMixin.length,matcher->stats);
  if (bVar2) {
    *matchStart = *inputOffset;
    *inputOffset = *inputOffset +
                   (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.super_LiteralMixin.length
    ;
    *instPointer = *instPointer + 0x449;
  }
  else {
    *matchStart = inputLength;
  }
  return !bVar2;
}

Assistant:

inline bool SyncToLiteralAndConsumeInstT<ScannerT>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (!this->Match(matcher, input, inputLength, inputOffset))
        {
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        matchStart = inputOffset;
        inputOffset += ScannerT::GetLiteralLength();
        instPointer += sizeof(*this);
        return false;
    }